

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

uint statehash(config *a)

{
  uint h;
  config *a_local;
  
  h = 0;
  for (a_local = a; a_local != (config *)0x0; a_local = a_local->bp) {
    h = h * 0x23b + a_local->rp->index * 0x25 + a_local->dot;
  }
  return h;
}

Assistant:

PRIVATE unsigned statehash(struct config *a)
{
  unsigned h=0;
  while( a ){
    h = h*571 + a->rp->index*37 + a->dot;
    a = a->bp;
  }
  return h;
}